

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ShapeFunctionsDerivativeY
          (ChElementHexaANCF_3813 *this,ShapeVector *Ny,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (2.0 / (this->m_InertFlexVec).m_data[1]) * 0.125;
  dVar2 = (1.0 - x) * dVar1;
  dVar3 = 1.0 - z;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[0] =
       dVar3 * -dVar2;
  dVar1 = (x + 1.0) * dVar1;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[1] =
       dVar3 * -dVar1;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[2] =
       dVar3 * dVar1;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[3] =
       dVar3 * dVar2;
  dVar3 = z + 1.0;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] =
       dVar3 * -dVar2;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar3 * -dVar1;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] =
       dVar3 * dVar1;
  (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar3 * dVar2;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(ShapeVector& Ny, double x, double y, double z) {
    double b = GetLengthY();

    Ny(0) = 2.0 / b * 0.125 * (1.0 - x) * (-1.0) * (1.0 - z);
    Ny(1) = 2.0 / b * 0.125 * (1.0 + x) * (-1.0) * (1.0 - z);
    Ny(2) = 2.0 / b * 0.125 * (1.0 + x) * (1.0) * (1.0 - z);
    Ny(3) = 2.0 / b * 0.125 * (1.0 - x) * (1.0) * (1.0 - z);
    Ny(4) = 2.0 / b * 0.125 * (1.0 - x) * (-1.0) * (1.0 + z);
    Ny(5) = 2.0 / b * 0.125 * (1.0 + x) * (-1.0) * (1.0 + z);
    Ny(6) = 2.0 / b * 0.125 * (1.0 + x) * (1.0) * (1.0 + z);
    Ny(7) = 2.0 / b * 0.125 * (1.0 - x) * (1.0) * (1.0 + z);
}